

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O1

NumericConstantChar NumericConstantChars::getChar(char c)

{
  undefined4 uVar1;
  NumericConstantChar NVar2;
  undefined7 in_register_00000039;
  
  NVar2 = Zero;
  uVar1 = (undefined4)CONCAT71(in_register_00000039,c);
  switch(uVar1) {
  case 0x2b:
    NVar2 = PlusSign;
    break;
  case 0x2c:
  case 0x2f:
  case 0x30:
    break;
  case 0x2d:
    return MinusSign;
  case 0x2e:
    return DecimalPoint;
  case 0x31:
    return One;
  case 0x32:
    return Two;
  case 0x33:
    return Three;
  case 0x34:
    return Four;
  case 0x35:
    return Five;
  case 0x36:
    return Six;
  case 0x37:
    return Seven;
  case 0x38:
    return Eight;
  case 0x39:
    return Nine;
  default:
    switch(uVar1) {
    case 0x61:
      return A;
    case 0x62:
      return B;
    case 99:
      return C;
    case 100:
      return D;
    case 0x65:
      return E;
    case 0x66:
      return F;
    case 0x69:
      return ImaginaryUnit;
    }
  }
  return NVar2;
}

Assistant:

NumericConstantChar NumericConstantChars::getChar(char c) {
	switch (c) {
		case '0':
			return NumericConstantChar::Zero;
		case '1':
			return NumericConstantChar::One;
		case '2':
			return NumericConstantChar::Two;
		case '3':
			return NumericConstantChar::Three;
		case '4':
			return NumericConstantChar::Four;
		case '5':
			return NumericConstantChar::Five;
		case '6':
			return NumericConstantChar::Six;
		case '7':
			return NumericConstantChar::Seven;
		case '8':
			return NumericConstantChar::Eight;
		case '9':
			return NumericConstantChar::Nine;
		case 'a':
			return NumericConstantChar::A;
		case 'b':
			return NumericConstantChar::B;
		case 'c':
			return NumericConstantChar::C;
		case 'd':
			return NumericConstantChar::D;
		case 'e':
			return NumericConstantChar::E;
		case 'f':
			return NumericConstantChar::F;
		case '-':
			return NumericConstantChar::MinusSign;
		case '+':
			return NumericConstantChar::PlusSign;
		case '.':
			return NumericConstantChar::DecimalPoint;
		case 'i':
			return NumericConstantChar::ImaginaryUnit;
		default:
			return NumericConstantChar::Zero;
	}
}